

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O1

void __thiscall
baryonyx::itm::
optimize_functor<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>
::operator()(optimize_functor<baryonyx::itm::solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>
             *this,atomic_bool *stop_task,
            best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
            *best_recorder,
            vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
            *constraints,int variables,default_cost_type<long_double> *original_costs,
            double cost_constant)

{
  local_context *ctx;
  context *ctx_00;
  context *ctx_01;
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  bool bVar6;
  int iVar7;
  longdouble in_ST0;
  longdouble theta;
  longdouble lVar8;
  longdouble lVar9;
  longdouble in_ST1;
  longdouble lVar10;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  double dVar11;
  default_cost_type<long_double> norm_costs;
  bit_array x;
  compute_order compute;
  solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
  slv;
  cost_type local_190;
  longdouble local_180;
  longdouble local_174;
  longdouble local_168;
  longdouble local_15c;
  long local_150;
  double local_148;
  double local_140;
  bit_array_impl local_138;
  compute_order local_128;
  longdouble local_f0;
  longdouble local_e4;
  longdouble local_d8;
  solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
  local_c8;
  
  bit_array_impl::bit_array_impl(&local_138,variables);
  ctx_00 = this->m_ctx;
  ctx = &this->m_local_ctx;
  normalize_costs<long_double,baryonyx::itm::default_cost_type<long_double>>
            ((itm *)&local_190,ctx_00,original_costs,&ctx->rng,variables);
  local_168 = (longdouble)(ctx_00->parameters).kappa_step;
  local_15c = (longdouble)(ctx_00->parameters).kappa_max;
  local_174 = (longdouble)(ctx_00->parameters).alpha;
  theta = (longdouble)(ctx_00->parameters).theta;
  dVar11 = (ctx_00->parameters).delta;
  if (0.0 <= dVar11) {
    lVar9 = (longdouble)dVar11;
    local_140 = dVar11;
  }
  else {
    ctx_01 = this->m_ctx;
    local_c8._0_10_ = theta;
    info<>(ctx_01,"  - delta not defined, compute it:\n");
    local_128.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._0_10_
         = _DAT_005f5850;
    if (variables != 0) {
      lVar4 = 0;
      do {
        lVar9 = *(longdouble *)
                 ((long)local_190.linear_elements._M_t.
                        super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t
                        .super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
                        super__Head_base<0UL,_long_double_*,_false>._M_head_impl + lVar4);
        lVar8 = ABS(lVar9);
        lVar10 = (longdouble)
                 local_128.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._0_10_;
        if (lVar8 <= (longdouble)
                     local_128.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._0_10_ ||
            (longdouble)
            local_128.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._0_10_ != lVar8) {
          lVar10 = lVar8;
        }
        if ((longdouble)0 != lVar9) {
          local_128.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _0_10_ = lVar10;
        }
        if (NAN((longdouble)0) || NAN(lVar9)) {
          local_128.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _0_10_ = lVar10;
        }
        lVar4 = lVar4 + 0x10;
        in_ST3 = in_ST2;
        in_ST4 = in_ST2;
        in_ST5 = in_ST2;
      } while ((ulong)(uint)variables << 4 != lVar4);
    }
    local_d8 = (longdouble)
               local_128.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._0_10_ -
               (longdouble)local_c8._0_10_ *
               (longdouble)
               local_128.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._0_10_;
    info<long_double,long_double,long_double>
              (ctx_01,"    - delta={} (min normalized cost:{} / theta: {})\n",&local_d8,
               (longdouble *)&local_128,(longdouble *)&local_c8);
    lVar9 = local_d8;
  }
  local_e4 = (longdouble)(ctx_00->parameters).pushing_k_factor;
  local_f0 = (longdouble)(ctx_00->parameters).pushing_objective_amplifier;
  local_150 = (long)(ctx_00->parameters).w;
  solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
  ::solver_inequalities_101coeff
            (&local_c8,&ctx->rng,
             (int)((ulong)((long)(constraints->
                                 super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(constraints->
                                super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333,
             variables,&local_190,constraints);
  compute_order::compute_order(&local_128,(ctx_00->parameters).order,variables);
  if (((stop_task->_M_base)._M_i & 1U) == 0) {
    bVar6 = false;
    do {
      this->m_call_number = this->m_call_number + 1;
      local_148 = best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
                  ::reinit(best_recorder,ctx,bVar6,(ctx_00->parameters).kappa_min,
                           (ctx_00->parameters).kappa_max,(bit_array *)&local_138);
      local_180 = (longdouble)local_148;
      compute_order::
      init<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>,baryonyx::bit_array>
                (&local_128,&local_c8,(bit_array *)&local_138);
      iVar5 = 0x7fffffff;
      if (((stop_task->_M_base)._M_i & 1U) == 0) {
        lVar4 = 0;
        bVar6 = false;
        lVar10 = local_180;
        while (lVar4 != (ctx_00->parameters).limit) {
          iVar7 = compute_order::
                  run<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>,baryonyx::bit_array,long_double>
                            (&local_128,&local_c8,(bit_array *)&local_138,&ctx->rng,lVar10,lVar9,
                             theta);
          if (iVar7 == 0) {
            dVar11 = default_cost_type<long_double>::results
                               (original_costs,(bit_array *)&local_138,cost_constant);
            best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
            ::try_update(best_recorder,ctx,(bit_array *)&local_138,dVar11,lVar4);
            bVar6 = true;
            iVar5 = 0;
            bVar1 = false;
          }
          else {
            if (iVar7 <= iVar5) {
              iVar5 = iVar7;
            }
            if (local_150 < lVar4) {
              powl();
              lVar10 = lVar10 + local_168 * in_ST0;
              in_ST0 = in_ST1;
              in_ST1 = in_ST2;
              in_ST2 = in_ST3;
              in_ST3 = in_ST4;
              in_ST4 = in_ST5;
            }
            bVar1 = lVar10 <= local_15c;
            in_ST5 = in_ST4;
          }
          if ((!bVar1) || (lVar4 = lVar4 + 1, ((stop_task->_M_base)._M_i & 1U) != 0)) break;
        }
      }
      else {
        bVar6 = false;
      }
      if (iVar5 < 1) {
        if (((stop_task->_M_base)._M_i & 1U) == 0) {
          iVar5 = 0;
          iVar7 = 0;
          do {
            if ((ctx_00->parameters).pushes_limit <= iVar7) break;
            iVar2 = compute_order::
                    push_and_run<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>,baryonyx::bit_array,long_double>
                              (&local_128,&local_c8,(bit_array *)&local_138,&ctx->rng,local_e4,lVar9
                               ,theta,local_f0);
            if (iVar2 == 0) {
              dVar11 = default_cost_type<long_double>::results
                                 (original_costs,(bit_array *)&local_138,cost_constant);
              best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
              ::try_update(best_recorder,ctx,(bit_array *)&local_138,dVar11,
                           (long)~((ctx_00->parameters).pushing_iteration_limit * iVar7));
              bVar6 = true;
            }
            if (((stop_task->_M_base)._M_i & 1U) == 0) {
              iVar2 = 1;
              lVar10 = local_180;
              while (iVar2 + -1 < (ctx_00->parameters).pushing_iteration_limit) {
                iVar3 = compute_order::
                        run<baryonyx::itm::solver_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,false>,baryonyx::bit_array,long_double>
                                  (&local_128,&local_c8,(bit_array *)&local_138,&ctx->rng,lVar10,
                                   lVar9,theta);
                if (iVar3 == 0) {
                  dVar11 = default_cost_type<long_double>::results
                                     (original_costs,(bit_array *)&local_138,cost_constant);
                  best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
                  ::try_update(best_recorder,ctx,(bit_array *)&local_138,dVar11,
                               (long)((ctx_00->parameters).pushing_iteration_limit * iVar5 - iVar2))
                  ;
                  bVar6 = true;
                  break;
                }
                if ((ctx_00->parameters).w < (double)(iVar2 + -1)) {
                  powl();
                  lVar10 = lVar10 + local_168 * in_ST0;
                  in_ST0 = in_ST1;
                  in_ST1 = in_ST2;
                  in_ST2 = in_ST3;
                  in_ST3 = in_ST4;
                  in_ST4 = in_ST5;
                }
                in_ST5 = in_ST4;
                if ((local_15c < lVar10) ||
                   (iVar2 = iVar2 + 1, ((stop_task->_M_base)._M_i & 1U) != 0)) break;
              }
            }
            iVar7 = iVar7 + 1;
            iVar5 = iVar5 + -1;
          } while (((stop_task->_M_base)._M_i & 1U) == 0);
        }
      }
      else {
        best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
        ::try_advance(best_recorder,ctx,(bit_array *)&local_138,iVar5,(ctx_00->parameters).limit);
      }
    } while (((stop_task->_M_base)._M_i & 1U) == 0);
  }
  if (local_128.m_order.
      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.m_order.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_128.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.m_order.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_128.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_128.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.R.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  solver_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_false>
  ::~solver_inequalities_101coeff(&local_c8);
  if ((_Head_base<0UL,_long_double_*,_false>)
      local_190.linear_elements._M_t.
      super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>._M_t.
      super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>.
      super__Head_base<0UL,_long_double_*,_false>._M_head_impl !=
      (_Head_base<0UL,_long_double_*,_false>)0x0) {
    operator_delete__((void *)local_190.linear_elements._M_t.
                              super___uniq_ptr_impl<long_double,_std::default_delete<long_double[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_long_double_*,_std::default_delete<long_double[]>_>
                              .super__Head_base<0UL,_long_double_*,_false>._M_head_impl);
  }
  if (local_138.m_data._M_t.
      super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
      super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>)0x0) {
    operator_delete__((void *)local_138.m_data._M_t.
                              super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>
                              .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void operator()(const std::atomic_bool& stop_task,
                    best_solution_recorder<Cost, Float, Mode>& best_recorder,
                    const std::vector<merged_constraint>& constraints,
                    int variables,
                    const Cost& original_costs,
                    double cost_constant)
    {
        bit_array x(variables);

        auto& p = m_ctx.parameters;

        auto norm_costs = normalize_costs<Float, Cost>(
          m_ctx, original_costs, m_local_ctx.rng, variables);

        const auto kappa_step = static_cast<Float>(p.kappa_step);
        const auto kappa_max = static_cast<Float>(p.kappa_max);
        const auto alpha = static_cast<Float>(p.alpha);
        const auto theta = static_cast<Float>(p.theta);
        const auto delta =
          p.delta < 0
            ? compute_delta<Float, Cost>(m_ctx, norm_costs, theta, variables)
            : static_cast<Float>(p.delta);

        const auto pushing_k_factor = static_cast<Float>(p.pushing_k_factor);
        const auto pushing_objective_amplifier =
          static_cast<Float>(p.pushing_objective_amplifier);

        const auto w_limit = static_cast<long int>(p.w);

        Solver slv(m_local_ctx.rng,
                   length(constraints),
                   variables,
                   norm_costs,
                   constraints);

        compute_order compute(p.order, variables);
        bool is_a_solution = false;

        while (!stop_task.load()) {
            ++m_call_number;
            const auto kappa_start = static_cast<Float>(best_recorder.reinit(
              m_local_ctx, is_a_solution, p.kappa_min, p.kappa_max, x));
            auto kappa = kappa_start;
            compute.init(slv, x);

            auto best_remaining = INT_MAX;
            is_a_solution = false;

            for (long int i = 0; !stop_task.load() && i != p.limit; ++i) {
                auto remaining =
                  compute.run(slv, x, m_local_ctx.rng, kappa, delta, theta);

                if (remaining == 0) {
                    best_recorder.try_update(
                      m_local_ctx,
                      x,
                      original_costs.results(x, cost_constant),
                      i);

                    best_remaining = 0;
                    is_a_solution = true;
                    break;
                } else {
                    best_remaining = std::min(remaining, best_remaining);
                }

                if (i > w_limit)
                    kappa +=
                      kappa_step * std::pow(static_cast<Float>(remaining) /
                                              static_cast<Float>(slv.m),
                                            alpha);

                if (kappa > kappa_max)
                    break;
            }

            if (best_remaining > 0) {
                best_recorder.try_advance(
                  m_local_ctx, x, best_remaining, p.limit);
                continue;
            }

            for (int push = 0; !stop_task.load() && push < p.pushes_limit;
                 ++push) {

                auto remaining =
                  compute.push_and_run(slv,
                                       x,
                                       m_local_ctx.rng,
                                       pushing_k_factor,
                                       delta,
                                       theta,
                                       pushing_objective_amplifier);

                if (remaining == 0) {
                    best_recorder.try_update(
                      m_local_ctx,
                      x,
                      original_costs.results(x, cost_constant),
                      -push * p.pushing_iteration_limit - 1);
                    is_a_solution = true;
                }

                kappa = kappa_start;
                for (int iter = 0;
                     !stop_task.load() && iter < p.pushing_iteration_limit;
                     ++iter) {

                    remaining = compute.run(
                      slv, x, m_local_ctx.rng, kappa, delta, theta);

                    if (remaining == 0) {
                        best_recorder.try_update(
                          m_local_ctx,
                          x,
                          original_costs.results(x, cost_constant),
                          -push * p.pushing_iteration_limit - iter - 1);
                        is_a_solution = true;
                        break;
                    }

                    if (iter > p.w)
                        kappa +=
                          kappa_step * std::pow(static_cast<Float>(remaining) /
                                                  static_cast<Float>(slv.m),
                                                alpha);

                    if (kappa > kappa_max)
                        break;
                }
            }
        }
    }